

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> * __thiscall
cfd::core::Psbt::GetTxOutKeyDataList
          (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__return_storage_ptr__,
          Psbt *this,uint32_t index)

{
  void *pvVar1;
  pointer __n;
  undefined8 *puVar2;
  KeyData local_250;
  uint32_t *local_100;
  size_t arr_index;
  uint32_t *val_arr;
  size_t arr_max;
  undefined1 local_d0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  ByteData fingerprint;
  undefined1 local_88 [8];
  Pubkey pubkey;
  ByteData key;
  size_t key_index;
  wally_map_item *item;
  size_t key_max;
  wally_psbt *psbt_pointer;
  uint32_t index_local;
  Psbt *this_local;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *arr;
  
  (*this->_vptr_Psbt[3])(this,(ulong)index,0xc11,"GetTxOutKeyDataList");
  pvVar1 = this->wally_psbt_pointer_;
  __n = *(pointer *)(*(long *)((long)pvVar1 + 0x28) + 0x28 + (ulong)index * 0xd0);
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            (__return_storage_ptr__);
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::reserve
            (__return_storage_ptr__,(size_type)__n);
  for (key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < __n;
      key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) {
    puVar2 = (undefined8 *)
             (*(long *)(*(long *)((long)pvVar1 + 0x28) + 0x20 + (ulong)index * 0xd0) +
             (long)key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage * 0x20);
    ByteData::ByteData((ByteData *)
                       &pubkey.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(uint8_t *)*puVar2,
                       *(uint32_t *)(puVar2 + 1));
    ByteData::ByteData((ByteData *)
                       &fingerprint.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (ByteData *)
                       &pubkey.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    Pubkey::Pubkey((Pubkey *)local_88,
                   (ByteData *)
                   &fingerprint.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    ByteData::~ByteData((ByteData *)
                        &fingerprint.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    ByteData::ByteData((ByteData *)
                       &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0);
    if (((puVar2[3] & 3) == 0) && (puVar2[3] != 0)) {
      ByteData::ByteData((ByteData *)&arr_max,(uint8_t *)puVar2[2],4);
      ByteData::operator=((ByteData *)
                          &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData *)&arr_max);
      ByteData::~ByteData((ByteData *)&arr_max);
      val_arr = (uint32_t *)((ulong)puVar2[3] >> 2);
      arr_index = puVar2[2];
      for (local_100 = (uint32_t *)0x1; local_100 < val_arr;
          local_100 = (uint32_t *)((long)local_100 + 1)) {
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0,
                   (value_type_conflict1 *)(arr_index + (long)local_100 * 4));
      }
    }
    KeyData::KeyData(&local_250,(Pubkey *)local_88,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0,
                     (ByteData *)
                     &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
    emplace_back<cfd::core::KeyData>(__return_storage_ptr__,&local_250);
    KeyData::~KeyData(&local_250);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0);
    ByteData::~ByteData((ByteData *)
                        &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    Pubkey::~Pubkey((Pubkey *)local_88);
    ByteData::~ByteData((ByteData *)
                        &pubkey.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<KeyData> Psbt::GetTxOutKeyDataList(uint32_t index) const {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  size_t key_max = psbt_pointer->outputs[index].keypaths.num_items;
  std::vector<KeyData> arr;
  arr.reserve(key_max);
  struct wally_map_item *item;
  for (size_t key_index = 0; key_index < key_max; ++key_index) {
    item = &psbt_pointer->outputs[index].keypaths.items[key_index];
    ByteData key(item->key, static_cast<uint32_t>(item->key_len));
    Pubkey pubkey(key);
    ByteData fingerprint;
    std::vector<uint32_t> path;
    if (((item->value_len % 4) == 0) && (item->value_len > 0)) {
      fingerprint = ByteData(item->value, 4);

      // TODO(k-matsuzawa) Need endian support.
      size_t arr_max = item->value_len / 4;
      uint32_t *val_arr = reinterpret_cast<uint32_t *>(item->value);
      for (size_t arr_index = 1; arr_index < arr_max; ++arr_index) {
        path.push_back(val_arr[arr_index]);
      }
    }
    arr.emplace_back(KeyData(pubkey, path, fingerprint));
  }
  return arr;
}